

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfoManager.cpp
# Opt level: O3

DWORD __thiscall Memory::HeapInfoManager::IdleDecommit(HeapInfoManager *this)

{
  DWORD DVar1;
  
  DVar1 = HeapInfo::IdleDecommit(&this->defaultHeap);
  return DVar1;
}

Assistant:

DWORD
HeapInfoManager::IdleDecommit()
{
    DWORD waitTime = INFINITE;
    ForEachHeapInfo([&](HeapInfo& heapInfo)
    {
        DWORD heapInfoWaitTime = heapInfo.IdleDecommit();
        waitTime = min(waitTime, heapInfoWaitTime);
    });
    return waitTime;
}